

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O0

void Packet::printPacket(char *buf,size_t len)

{
  ulong in_RSI;
  long in_RDI;
  size_t i;
  ulong local_18;
  
  for (local_18 = 0; local_18 < in_RSI; local_18 = local_18 + 1) {
    if ((local_18 & 7) == 0) {
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    }
    printf("%02hhx|",(ulong)(uint)(int)*(char *)(in_RDI + local_18));
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Packet::printPacket(const char* const buf, const size_t len) {
  for (size_t i = 0; i < len; ++i) {
    if (i % 8 == 0) {
      std::cout << std::endl;
    }
    printf("%02hhx|", buf[i]);
  }
  std::cout << std::endl;
}